

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
Data(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this,
    Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  ulong uVar5;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *pNVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  uchar *puVar10;
  TouchPoint *pTVar11;
  size_t sVar12;
  byte bVar13;
  R RVar14;
  
  bVar13 = 0;
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar9);
  this->spans = (Span *)RVar14.spans;
  if (RVar14.nSpans != 0) {
    lVar8 = 0;
    sVar9 = 0;
    do {
      pSVar2 = other->spans;
      sVar12 = 0;
      do {
        uVar5 = (ulong)pSVar2->offsets[sVar12 + lVar8];
        if (uVar5 != 0xff) {
          pEVar3 = pSVar2[sVar9].entries;
          pNVar6 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                   ::insert(this->spans + sVar9,sVar12);
          pEVar1 = pEVar3 + uVar5;
          pNVar6->key = *(int *)(pEVar1->storage).data;
          memcpy(&pNVar6->value,(pEVar1->storage).data + 8,0xb0);
          puVar10 = pEVar3[uVar5].storage.data + 0xb8;
          pTVar11 = &(pNVar6->value).touchPoint;
          for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
            *(undefined8 *)pTVar11 = *(undefined8 *)puVar10;
            puVar10 = puVar10 + (ulong)bVar13 * -0x10 + 8;
            pTVar11 = (TouchPoint *)((long)pTVar11 + (ulong)bVar13 * -0x10 + 8);
          }
          (pNVar6->value).touchPoint.velocity.v[1] = *(float *)((pEVar1->storage).data + 0x110);
          pDVar4 = *(Data **)((pEVar1->storage).data + 0x118);
          (pNVar6->value).touchPoint.rawPositions.d.d = pDVar4;
          (pNVar6->value).touchPoint.rawPositions.d.ptr =
               *(QPointF **)((pEVar1->storage).data + 0x120);
          (pNVar6->value).touchPoint.rawPositions.d.size =
               *(qsizetype *)((pEVar1->storage).data + 0x128);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (sVar9 != RVar14.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }